

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles3::Functional::VertexIDCase::iterate(VertexIDCase *this)

{
  allocator<unsigned_short> *paVar1;
  int height_00;
  code *pcVar2;
  bool bVar3;
  value_type vVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  deUint32 dVar8;
  RenderContext *pRVar9;
  undefined4 extraout_var;
  RenderTarget *pRVar11;
  size_type sVar12;
  reference pvVar13;
  TestLog *pTVar14;
  reference pvVar15;
  reference pvVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  PixelBufferAccess local_3c0;
  PixelBufferAccess local_398;
  PixelBufferAccess local_370;
  int local_344;
  iterator iStack_340;
  int ndx_4;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_338;
  int local_330;
  allocator<tcu::Vector<float,_4>_> local_329;
  int ndx_3;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> mappedPos_1;
  undefined1 local_308 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices_2;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  ScopedLogSection local_2a0;
  ScopedLogSection logSection_2;
  PixelBufferAccess local_270;
  int local_244;
  iterator iStack_240;
  int ndx_2;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_238;
  int local_230;
  allocator<tcu::Vector<float,_4>_> local_229;
  int ndx_1;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> mappedPos;
  undefined1 local_208 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices_1;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  ScopedLogSection local_1a0;
  ScopedLogSection logSection_1;
  int local_16c;
  int ndx;
  allocator<unsigned_short> local_139;
  undefined1 local_138 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  ScopedLogSection local_d0;
  ScopedLogSection logSection;
  undefined1 local_a0 [8];
  Vec4 clearColor;
  int colorsLoc;
  int posLoc;
  int viewportY;
  int viewportX;
  Surface testImg;
  undefined1 local_58 [8];
  Surface refImg;
  Random rnd;
  float threshold;
  int viewportH;
  int viewportW;
  int height;
  int width;
  Functions *gl;
  VertexIDCase *this_local;
  long lVar10;
  
  pRVar9 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar5 = (*pRVar9->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar5);
  pRVar11 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar6 = tcu::RenderTarget::getWidth(pRVar11);
  pRVar11 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar7 = tcu::RenderTarget::getHeight(pRVar11);
  iVar5 = this->m_viewportW;
  height_00 = this->m_viewportH;
  dVar8 = ::deInt32Hash(this->m_iterNdx);
  de::Random::Random((Random *)((long)&refImg.m_pixels.m_cap + 4),dVar8 ^ 0xcf23ab1);
  tcu::Surface::Surface((Surface *)local_58,iVar5,height_00);
  tcu::Surface::Surface((Surface *)&viewportY,iVar5,height_00);
  iVar6 = de::Random::getInt((Random *)((long)&refImg.m_pixels.m_cap + 4),0,iVar6 - iVar5);
  iVar7 = de::Random::getInt((Random *)((long)&refImg.m_pixels.m_cap + 4),0,iVar7 - height_00);
  pcVar2 = *(code **)(lVar10 + 0x780);
  dVar8 = glu::ShaderProgram::getProgram(this->m_program);
  clearColor.m_data[3] = (float)(*pcVar2)(dVar8,"a_position");
  pcVar2 = *(code **)(lVar10 + 0xb48);
  dVar8 = glu::ShaderProgram::getProgram(this->m_program);
  clearColor.m_data[2] = (float)(*pcVar2)(dVar8,"u_colors[0]");
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_a0,0.0,0.0,0.0,1.0);
  (**(code **)(lVar10 + 0x1a00))(iVar6,iVar7,iVar5,height_00);
  pcVar2 = *(code **)(lVar10 + 0x1680);
  dVar8 = glu::ShaderProgram::getProgram(this->m_program);
  (*pcVar2)(dVar8);
  (**(code **)(lVar10 + 0x40))(0x8892,this->m_positionBuffer);
  (**(code **)(lVar10 + 0x610))(clearColor.m_data[3]);
  (**(code **)(lVar10 + 0x19f0))(clearColor.m_data[3],4,0x1406,0,0,0);
  fVar17 = clearColor.m_data[2];
  pcVar2 = *(code **)(lVar10 + 0x15a8);
  sVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                     (&this->m_colors);
  pvVar13 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                      (&this->m_colors,0);
  (*pcVar2)(fVar17,sVar12 & 0xffffffff,pvVar13);
  pcVar2 = *(code **)(lVar10 + 0x1c0);
  fVar17 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_a0);
  fVar18 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_a0);
  fVar19 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_a0);
  fVar20 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_a0);
  (*pcVar2)(fVar17,fVar18,fVar19,fVar20);
  (**(code **)(lVar10 + 0x188))(0x4000);
  tcu::Surface::getAccess((PixelBufferAccess *)&logSection,(Surface *)local_58);
  tcu::clear((PixelBufferAccess *)&logSection,(Vec4 *)local_a0);
  if (this->m_iterNdx == 0) {
    pTVar14 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"Iter0",&local_f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"glDrawArrays()",
               (allocator<char> *)
               ((long)&indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    tcu::ScopedLogSection::ScopedLogSection(&local_d0,pTVar14,&local_f0,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    sVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                       (&this->m_positions);
    std::allocator<unsigned_short>::allocator(&local_139);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_138,sVar12,
               &local_139);
    std::allocator<unsigned_short>::~allocator(&local_139);
    pcVar2 = *(code **)(lVar10 + 0x150);
    sVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                       (&this->m_positions);
    pvVar13 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[](&this->m_positions,0);
    (*pcVar2)(0x8892,(long)((int)sVar12 << 4),pvVar13,0x88e8);
    pcVar2 = *(code **)(lVar10 + 0x538);
    sVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                       (&this->m_positions);
    (*pcVar2)(4,0,sVar12 & 0xffffffff);
    pRVar9 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
    tcu::Surface::getAccess((PixelBufferAccess *)&stack0xfffffffffffffe98,(Surface *)&viewportY);
    glu::readPixels(pRVar9,iVar6,iVar7,(PixelBufferAccess *)&stack0xfffffffffffffe98);
    dVar8 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar8,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderBuiltinVarTests.cpp"
                    ,0x3ee);
    for (local_16c = 0;
        sVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_138),
        local_16c < (int)sVar12; local_16c = local_16c + 1) {
      pvVar15 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_138,
                           (long)local_16c);
      *pvVar15 = (value_type)local_16c;
    }
    tcu::Surface::getAccess((PixelBufferAccess *)&logSection_1,(Surface *)local_58);
    sVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                       (&this->m_positions);
    pvVar15 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_138,0);
    pvVar13 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[](&this->m_positions,0);
    pvVar16 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[](&this->m_colors,0);
    renderReference(this,(PixelBufferAccess *)&logSection_1,(int)sVar12,pvVar15,pvVar13,pvVar16);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_138);
    tcu::ScopedLogSection::~ScopedLogSection(&local_d0);
  }
  else if (this->m_iterNdx == 1) {
    pTVar14 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"Iter1",&local_1c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"glDrawElements(), indices in client-side array",
               (allocator<char> *)
               ((long)&indices_1.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    tcu::ScopedLogSection::ScopedLogSection(&local_1a0,pTVar14,&local_1c0,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&indices_1.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string((string *)&local_1c0);
    std::allocator<char>::~allocator(&local_1c1);
    sVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                       (&this->m_positions);
    paVar1 = (allocator<unsigned_short> *)
             ((long)&mappedPos.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<unsigned_short>::allocator(paVar1);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_208,sVar12,paVar1);
    std::allocator<unsigned_short>::~allocator
              ((allocator<unsigned_short> *)
               ((long)&mappedPos.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    sVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                       (&this->m_positions);
    std::allocator<tcu::Vector<float,_4>_>::allocator(&local_229);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&ndx_1,
               sVar12,&local_229);
    std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_229);
    for (local_230 = 0; iVar5 = local_230,
        sVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_208),
        iVar5 < (int)sVar12; local_230 = local_230 + 1) {
      vVar4 = (value_type)local_230;
      pvVar15 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_208,
                           (long)local_230);
      *pvVar15 = vVar4;
    }
    local_238._M_current =
         (unsigned_short *)
         std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                   ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_208);
    iStack_240 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_208);
    de::Random::
    shuffle<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
              ((Random *)((long)&refImg.m_pixels.m_cap + 4),local_238,
               (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                )iStack_240._M_current);
    for (local_244 = 0; iVar5 = local_244,
        sVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_208),
        iVar5 < (int)sVar12; local_244 = local_244 + 1) {
      pvVar13 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[](&this->m_positions,(long)local_244);
      pvVar15 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_208,
                           (long)local_244);
      pvVar16 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )&ndx_1,(ulong)*pvVar15);
      *(undefined8 *)pvVar16->m_data = *(undefined8 *)pvVar13->m_data;
      *(undefined8 *)(pvVar16->m_data + 2) = *(undefined8 *)(pvVar13->m_data + 2);
    }
    pcVar2 = *(code **)(lVar10 + 0x150);
    sVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                       (&this->m_positions);
    pvVar13 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         &ndx_1,0);
    (*pcVar2)(0x8892,(long)((int)sVar12 << 4),pvVar13,0x88e8);
    pcVar2 = *(code **)(lVar10 + 0x568);
    sVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_208);
    pvVar15 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_208,0);
    (*pcVar2)(4,sVar12 & 0xffffffff,0x1403,pvVar15);
    pRVar9 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
    tcu::Surface::getAccess(&local_270,(Surface *)&viewportY);
    glu::readPixels(pRVar9,iVar6,iVar7,&local_270);
    dVar8 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar8,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderBuiltinVarTests.cpp"
                    ,0x409);
    tcu::Surface::getAccess((PixelBufferAccess *)&logSection_2,(Surface *)local_58);
    sVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_208);
    pvVar15 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_208,0);
    pvVar13 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         &ndx_1,0);
    pvVar16 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[](&this->m_colors,0);
    renderReference(this,(PixelBufferAccess *)&logSection_2,(int)sVar12,pvVar15,pvVar13,pvVar16);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&ndx_1);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_208);
    tcu::ScopedLogSection::~ScopedLogSection(&local_1a0);
  }
  else if (this->m_iterNdx == 2) {
    pTVar14 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"Iter2",&local_2c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e8,"glDrawElements(), indices in buffer",
               (allocator<char> *)
               ((long)&indices_2.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    tcu::ScopedLogSection::ScopedLogSection(&local_2a0,pTVar14,&local_2c0,&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&indices_2.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string((string *)&local_2c0);
    std::allocator<char>::~allocator(&local_2c1);
    sVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                       (&this->m_positions);
    paVar1 = (allocator<unsigned_short> *)
             ((long)&mappedPos_1.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<unsigned_short>::allocator(paVar1);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_308,sVar12,paVar1);
    std::allocator<unsigned_short>::~allocator
              ((allocator<unsigned_short> *)
               ((long)&mappedPos_1.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    sVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                       (&this->m_positions);
    std::allocator<tcu::Vector<float,_4>_>::allocator(&local_329);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&ndx_3,
               sVar12,&local_329);
    std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_329);
    for (local_330 = 0; iVar5 = local_330,
        sVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_308),
        iVar5 < (int)sVar12; local_330 = local_330 + 1) {
      vVar4 = (value_type)local_330;
      pvVar15 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_308,
                           (long)local_330);
      *pvVar15 = vVar4;
    }
    local_338._M_current =
         (unsigned_short *)
         std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                   ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_308);
    iStack_340 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_308);
    de::Random::
    shuffle<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
              ((Random *)((long)&refImg.m_pixels.m_cap + 4),local_338,
               (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                )iStack_340._M_current);
    for (local_344 = 0; iVar5 = local_344,
        sVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_308),
        iVar5 < (int)sVar12; local_344 = local_344 + 1) {
      pvVar13 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[](&this->m_positions,(long)local_344);
      pvVar15 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_308,
                           (long)local_344);
      pvVar16 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )&ndx_3,(ulong)*pvVar15);
      *(undefined8 *)pvVar16->m_data = *(undefined8 *)pvVar13->m_data;
      *(undefined8 *)(pvVar16->m_data + 2) = *(undefined8 *)(pvVar13->m_data + 2);
    }
    (**(code **)(lVar10 + 0x40))(0x8893,this->m_elementBuffer);
    pcVar2 = *(code **)(lVar10 + 0x150);
    sVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_308);
    pvVar15 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_308,0);
    (*pcVar2)(0x8893,(long)((int)sVar12 * 2),pvVar15,0x88e8);
    pcVar2 = *(code **)(lVar10 + 0x150);
    sVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                       (&this->m_positions);
    pvVar13 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         &ndx_3,0);
    (*pcVar2)(0x8892,(long)((int)sVar12 << 4),pvVar13,0x88e8);
    pcVar2 = *(code **)(lVar10 + 0x568);
    sVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_308);
    (*pcVar2)(4,sVar12 & 0xffffffff,0x1403,0);
    pRVar9 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
    tcu::Surface::getAccess(&local_370,(Surface *)&viewportY);
    glu::readPixels(pRVar9,iVar6,iVar7,&local_370);
    dVar8 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar8,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderBuiltinVarTests.cpp"
                    ,0x423);
    tcu::Surface::getAccess(&local_398,(Surface *)local_58);
    tcu::clear(&local_398,(Vec4 *)local_a0);
    tcu::Surface::getAccess(&local_3c0,(Surface *)local_58);
    sVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_308);
    pvVar15 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_308,0);
    pvVar13 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         &ndx_3,0);
    pvVar16 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[](&this->m_colors,0);
    renderReference(this,&local_3c0,(int)sVar12,pvVar15,pvVar13,pvVar16);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&ndx_3);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_308);
    tcu::ScopedLogSection::~ScopedLogSection(&local_2a0);
  }
  pTVar14 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  bVar3 = tcu::fuzzyCompare(pTVar14,"Result","Image comparison result",(Surface *)local_58,
                            (Surface *)&viewportY,0.02,COMPARE_LOG_RESULT);
  if (!bVar3) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
  }
  this->m_iterNdx = this->m_iterNdx + 1;
  iVar5 = this->m_iterNdx;
  tcu::Surface::~Surface((Surface *)&viewportY);
  tcu::Surface::~Surface((Surface *)local_58);
  de::Random::~Random((Random *)((long)&refImg.m_pixels.m_cap + 4));
  return (uint)(iVar5 < 3);
}

Assistant:

VertexIDCase::IterateResult VertexIDCase::iterate (void)
{
	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	const int				width		= m_context.getRenderTarget().getWidth();
	const int				height		= m_context.getRenderTarget().getHeight();
	const int				viewportW	= m_viewportW;
	const int				viewportH	= m_viewportH;

	const float				threshold	= 0.02f;

	de::Random				rnd			(0xcf23ab1 ^ deInt32Hash(m_iterNdx));
	tcu::Surface			refImg		(viewportW, viewportH);
	tcu::Surface			testImg		(viewportW, viewportH);

	const int				viewportX	= rnd.getInt(0, width-viewportW);
	const int				viewportY	= rnd.getInt(0, height-viewportH);

	const int				posLoc		= gl.getAttribLocation(m_program->getProgram(), "a_position");
	const int				colorsLoc	= gl.getUniformLocation(m_program->getProgram(), "u_colors[0]");
	const tcu::Vec4			clearColor	(0.0f, 0.0f, 0.0f, 1.0f);

	// Setup common state.
	gl.viewport					(viewportX, viewportY, viewportW, viewportH);
	gl.useProgram				(m_program->getProgram());
	gl.bindBuffer				(GL_ARRAY_BUFFER, m_positionBuffer);
	gl.enableVertexAttribArray	(posLoc);
	gl.vertexAttribPointer		(posLoc, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
	gl.uniform4fv				(colorsLoc, (int)m_colors.size(), (const float*)&m_colors[0]);

	// Clear render target to black.
	gl.clearColor	(clearColor.x(), clearColor.y(), clearColor.z(), clearColor.w());
	gl.clear		(GL_COLOR_BUFFER_BIT);

	tcu::clear(refImg.getAccess(), clearColor);

	if (m_iterNdx == 0)
	{
		tcu::ScopedLogSection	logSection	(m_testCtx.getLog(), "Iter0", "glDrawArrays()");
		vector<deUint16>		indices		(m_positions.size());

		gl.bufferData(GL_ARRAY_BUFFER, (int)(m_positions.size()*sizeof(tcu::Vec4)), &m_positions[0], GL_DYNAMIC_DRAW);
		gl.drawArrays(GL_TRIANGLES, 0, (int)m_positions.size());

		glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, testImg.getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");

		// Reference indices
		for (int ndx = 0; ndx < (int)indices.size(); ndx++)
			indices[ndx] = (deUint16)ndx;

		renderReference(refImg.getAccess(), (int)m_positions.size(), &indices[0], &m_positions[0], &m_colors[0]);
	}
	else if (m_iterNdx == 1)
	{
		tcu::ScopedLogSection	logSection	(m_testCtx.getLog(), "Iter1", "glDrawElements(), indices in client-side array");
		vector<deUint16>		indices		(m_positions.size());
		vector<tcu::Vec4>		mappedPos	(m_positions.size());

		// Compute initial indices and suffle
		for (int ndx = 0; ndx < (int)indices.size(); ndx++)
			indices[ndx] = (deUint16)ndx;
		rnd.shuffle(indices.begin(), indices.end());

		// Use indices to re-map positions.
		for (int ndx = 0; ndx < (int)indices.size(); ndx++)
			mappedPos[indices[ndx]] = m_positions[ndx];

		gl.bufferData(GL_ARRAY_BUFFER, (int)(m_positions.size()*sizeof(tcu::Vec4)), &mappedPos[0], GL_DYNAMIC_DRAW);
		gl.drawElements(GL_TRIANGLES, (int)indices.size(), GL_UNSIGNED_SHORT, &indices[0]);

		glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, testImg.getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");

		renderReference(refImg.getAccess(), (int)indices.size(), &indices[0], &mappedPos[0], &m_colors[0]);
	}
	else if (m_iterNdx == 2)
	{
		tcu::ScopedLogSection	logSection	(m_testCtx.getLog(), "Iter2", "glDrawElements(), indices in buffer");
		vector<deUint16>		indices		(m_positions.size());
		vector<tcu::Vec4>		mappedPos	(m_positions.size());

		// Compute initial indices and suffle
		for (int ndx = 0; ndx < (int)indices.size(); ndx++)
			indices[ndx] = (deUint16)ndx;
		rnd.shuffle(indices.begin(), indices.end());

		// Use indices to re-map positions.
		for (int ndx = 0; ndx < (int)indices.size(); ndx++)
			mappedPos[indices[ndx]] = m_positions[ndx];

		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_elementBuffer);
		gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, (int)(indices.size()*sizeof(deUint16)), &indices[0], GL_DYNAMIC_DRAW);

		gl.bufferData(GL_ARRAY_BUFFER, (int)(m_positions.size()*sizeof(tcu::Vec4)), &mappedPos[0], GL_DYNAMIC_DRAW);
		gl.drawElements(GL_TRIANGLES, (int)indices.size(), GL_UNSIGNED_SHORT, DE_NULL);

		glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, testImg.getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");

		tcu::clear(refImg.getAccess(), clearColor);
		renderReference(refImg.getAccess(), (int)indices.size(), &indices[0], &mappedPos[0], &m_colors[0]);
	}
	else
		DE_ASSERT(false);

	if (!tcu::fuzzyCompare(m_testCtx.getLog(), "Result", "Image comparison result", refImg, testImg, threshold, tcu::COMPARE_LOG_RESULT))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");

	m_iterNdx += 1;
	return (m_iterNdx < 3) ? CONTINUE : STOP;
}